

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,bool>::emplace<bool_const&>(QHash<QString,_bool> *this,QString *key,bool *args)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  piter pVar1;
  QString copy;
  QString *in_stack_ffffffffffffff88;
  bool *args_00;
  QString *in_stack_ffffffffffffffa0;
  QHash<QString,_bool> *in_stack_ffffffffffffffa8;
  bool local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0x10] = true;
  local_28[0x11] = true;
  local_28[0x12] = true;
  local_28[0x13] = true;
  local_28[0x14] = true;
  local_28[0x15] = true;
  local_28[0x16] = true;
  local_28[0x17] = true;
  local_28[0] = true;
  local_28[1] = true;
  local_28[2] = true;
  local_28[3] = true;
  local_28[4] = true;
  local_28[5] = true;
  local_28[6] = true;
  local_28[7] = true;
  local_28[8] = true;
  local_28[9] = true;
  local_28[10] = true;
  local_28[0xb] = true;
  local_28[0xc] = true;
  local_28[0xd] = true;
  local_28[0xe] = true;
  local_28[0xf] = true;
  args_00 = local_28;
  QString::QString(in_RDI,in_stack_ffffffffffffff88);
  pVar1 = (piter)emplace<bool_const&>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,args_00);
  QString::~QString((QString *)0x1b0ca6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }